

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OneWireAnalyzerResults.cpp
# Opt level: O0

void __thiscall
OneWireAnalyzerResults::GenerateBubbleText
          (OneWireAnalyzerResults *this,U64 frame_index,Channel *param_2,DisplayBase display_base)

{
  char local_e8 [8];
  char number_str [128];
  bool warning_flag;
  Frame local_50 [8];
  Frame frame;
  ulonglong local_40;
  undefined1 local_30;
  byte local_2f;
  DisplayBase display_base_local;
  Channel *param_2_local;
  U64 frame_index_local;
  OneWireAnalyzerResults *this_local;
  
  AnalyzerResults::GetFrame((ulonglong)local_50);
  AnalyzerResults::ClearResultStrings();
  AnalyzerHelpers::GetNumberString(local_40,display_base,8,local_e8,0x80);
  switch(local_30) {
  case 0:
    if ((local_2f & 0x40) == 0) {
      AnalyzerResults::AddResultString
                ((char *)this,"R",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET condition",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      AnalyzerResults::AddResultString
                ((char *)this,"R!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET - WARNING",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET - warning, too short.",(char *)0x0,(char *)0x0,(char *)0x0,
                 (char *)0x0);
      AnalyzerResults::AddResultString
                ((char *)this,"RESET - warning, pulse shorter than 480us",(char *)0x0,(char *)0x0,
                 (char *)0x0,(char *)0x0);
    }
    break;
  case 1:
    AnalyzerResults::AddResultString
              ((char *)this,"P",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"PRESENCE",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"PRESENCE condition",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 2:
    AnalyzerResults::AddResultString
              ((char *)this,"READ",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"READ ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"READ ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 3:
    AnalyzerResults::AddResultString
              ((char *)this,"SKIP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SKIP ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SKIP ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 4:
    AnalyzerResults::AddResultString
              ((char *)this,"SEARCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SEARCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"SEARCH ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 5:
    AnalyzerResults::AddResultString
              ((char *)this,"MATCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"MATCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"MATCH ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 6:
    AnalyzerResults::AddResultString
              ((char *)this,"OD SKIP",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE SKIP ROM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE SKIP ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 7:
    AnalyzerResults::AddResultString
              ((char *)this,"OD MATCH",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE MATCH COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"OVERDRIVE MATCH ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 8:
    AnalyzerResults::AddResultString
              ((char *)this,"CRC",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"CRC: [",local_e8,"]",(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"CRC section from ROM: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 9:
    AnalyzerResults::AddResultString
              ((char *)this,"FAMILY",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"FAMILY: [",local_e8,"]",(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"FAMILY CODE section from ROM: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 10:
    AnalyzerHelpers::GetNumberString(local_40,display_base,0x30,local_e8,0x80);
    AnalyzerResults::AddResultString
              ((char *)this,"ROM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"ROM: [",local_e8,"]",(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ROM CODE section from ROM: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xb:
    AnalyzerResults::AddResultString
              ((char *)this,"D",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"DATA",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"DATA: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xc:
    AnalyzerResults::AddResultString
              ((char *)this,"Z",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"BIT",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"BIT - ERROR.",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    break;
  case 0xd:
    AnalyzerResults::AddResultString
              ((char *)this,"COMMAND!",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"INVALID ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"Invalid ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
    break;
  case 0xe:
    AnalyzerResults::AddResultString
              ((char *)this,"ALARM",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ALARM SEARCH ROM COMMAND",(char *)0x0,(char *)0x0,(char *)0x0,
               (char *)0x0);
    AnalyzerResults::AddResultString
              ((char *)this,"ALARM SEARCH ROM command: [",local_e8,"]",(char *)0x0,(char *)0x0);
  }
  Frame::~Frame(local_50);
  return;
}

Assistant:

void OneWireAnalyzerResults::GenerateBubbleText( U64 frame_index, Channel& /*channel*/,
                                                 DisplayBase display_base ) // unrefereced vars commented out to remove warnings.
{
    Frame frame = GetFrame( frame_index );
    ClearResultStrings();

    bool warning_flag = false;
    if( ( frame.mFlags & DISPLAY_AS_WARNING_FLAG ) != 0 )
        warning_flag = true;


    // RestartPulse, PresencePulse, ReadRomFrame, SkipRomFrame, SearchRomFrame, AlarmSearchFrame, MatchRomFrame, OverdriveSkipRomFrame,
    // OverdriveMatchRomFrame, CRC, FamilyCode, Rom, Byte, Bit
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );

    switch( ( OneWireFrameType )frame.mType )
    {
    case RestartPulse:
    {
        if( warning_flag == false )
        {
            AddResultString( "R" );
            AddResultString( "RESET" );
            AddResultString( "RESET condition" );
        }
        else
        {
            AddResultString( "R!" );
            AddResultString( "RESET - WARNING" );
            AddResultString( "RESET - warning, too short." );
            AddResultString( "RESET - warning, pulse shorter than 480us" );
        }
    }
    break;
    case PresencePulse:
    {
        AddResultString( "P" );
        AddResultString( "PRESENCE" );
        AddResultString( "PRESENCE condition" );
    }
    break;
    case ReadRomFrame:
    {
        AddResultString( "READ" );
        AddResultString( "READ ROM COMMAND" );
        AddResultString( "READ ROM command: [", number_str, "]" );
    }
    break;
    case SkipRomFrame:
    {
        AddResultString( "SKIP" );
        AddResultString( "SKIP ROM COMMAND" );
        AddResultString( "SKIP ROM command: [", number_str, "]" );
    }
    break;
    case SearchRomFrame:
    {
        AddResultString( "SEARCH" );
        AddResultString( "SEARCH ROM COMMAND" );
        AddResultString( "SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case AlarmSearchFrame:
    {
        AddResultString( "ALARM" );
        AddResultString( "ALARM SEARCH ROM COMMAND" );
        AddResultString( "ALARM SEARCH ROM command: [", number_str, "]" );
    }
    break;
    case MatchRomFrame:
    {
        AddResultString( "MATCH" );
        AddResultString( "MATCH ROM COMMAND" );
        AddResultString( "MATCH ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveSkipRomFrame:
    {
        AddResultString( "OD SKIP" );
        AddResultString( "OVERDRIVE SKIP ROM" );
        AddResultString( "OVERDRIVE SKIP ROM command: [", number_str, "]" );
    }
    break;
    case OverdriveMatchRomFrame:
    {
        AddResultString( "OD MATCH" );
        AddResultString( "OVERDRIVE MATCH COMMAND" );
        AddResultString( "OVERDRIVE MATCH ROM command: [", number_str, "]" );
    }
    break;
    case CRC:
    {
        AddResultString( "CRC" );
        AddResultString( "CRC: [", number_str, "]" );
        AddResultString( "CRC section from ROM: [", number_str, "]" );
    }
    break;
    case FamilyCode:
    {
        AddResultString( "FAMILY" );
        AddResultString( "FAMILY: [", number_str, "]" );
        AddResultString( "FAMILY CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Rom:
    {
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 48, number_str, 128 );
        AddResultString( "ROM" );
        AddResultString( "ROM: [", number_str, "]" );
        AddResultString( "ROM CODE section from ROM: [", number_str, "]" );
    }
    break;
    case Byte:
    {
        AddResultString( "D" );
        AddResultString( "DATA" );
        AddResultString( "DATA: [", number_str, "]" );
    }
    break;
    case Bit:
    {
        AddResultString( "Z" );
        AddResultString( "BIT" );
        AddResultString( "BIT - ERROR." );
    }
    break;
    case InvalidRomCommandFrame:
    {
        AddResultString( "COMMAND!" );
        AddResultString( "INVALID ROM COMMAND" );
        AddResultString( "Invalid ROM command: [", number_str, "]" );
    }
    break;
    }
}